

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImGuiCond IVar2;
  ImVec2 pos_00;
  ImVec2 IVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  char *text;
  bool bVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImU32 IVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *g;
  uint uVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar13;
  bool hovered;
  bool held;
  char name [16];
  ImRect frame_bb;
  ImRect r_outer;
  ImVec2 size_expected;
  ImRect value_bb;
  ImVec2 pos;
  ImRect total_bb;
  bool local_f5;
  float local_f4;
  ImGuiID local_f0;
  bool local_e9;
  ImVec2 local_e8 [2];
  ImRect local_d8;
  ImGuiCond local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImDrawList *local_a0;
  char *local_98;
  char *local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar5 = GImGui;
  IVar2 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar10 = pIVar5->CurrentWindow;
  pIVar10->WriteAccessed = true;
  if (pIVar10->SkipItems != false) {
    return false;
  }
  local_98 = preview_value;
  IVar8 = ImGuiWindow::GetID(pIVar10,label,(char *)0x0);
  local_f4 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_f4 = GetFrameHeight();
  }
  IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_4_ = IVar3.x;
  local_68._4_4_ = IVar3.y;
  local_68._12_4_ = extraout_XMM0_Dd;
  local_b8 = local_f4;
  fVar12 = IVar3.x;
  fVar13 = IVar3.y;
  if ((flags & 0x40U) == 0) {
    local_b8 = CalcItemWidth();
    uStack_b4 = extraout_XMM0_Db;
    uStack_b0 = extraout_XMM0_Dc_00;
    uStack_ac = extraout_XMM0_Dd_00;
    fVar12 = (float)local_68._0_4_;
    fVar13 = (float)local_68._4_4_;
  }
  fVar1 = (pIVar5->Style).FramePadding.y;
  local_d8.Min.x = (pIVar10->DC).CursorPos.x;
  local_d8.Min.y = (pIVar10->DC).CursorPos.y;
  local_d8.Max.x = local_b8 + local_d8.Min.x;
  local_d8.Max.y = fVar1 + fVar1 + fVar13 + local_d8.Min.y;
  local_40.Max.x = 0.0;
  if (0.0 < fVar12) {
    local_40.Max.x = (pIVar5->Style).ItemInnerSpacing.x + fVar12;
  }
  local_40.Max.x = local_40.Max.x + local_d8.Max.x;
  local_40.Max.y = local_d8.Max.y + 0.0;
  local_f0 = IVar8;
  local_90 = label;
  local_40.Min.x = local_d8.Min.x;
  local_40.Min.y = local_d8.Min.y;
  ItemSize(&local_40,fVar1);
  IVar8 = local_f0;
  bVar6 = ItemAdd(&local_40,local_f0,&local_d8);
  if (!bVar6) {
    return false;
  }
  local_bc = IVar2;
  bVar6 = ButtonBehavior(&local_d8,IVar8,&local_f5,&local_e9,0);
  bVar7 = IsPopupOpen(IVar8);
  local_58 = CONCAT44(local_d8.Min.y,local_d8.Min.x);
  local_50.y = local_d8.Max.y;
  local_50.x = local_d8.Max.x - local_f4;
  IVar9 = GetColorU32(local_f5 + 7,1.0);
  RenderNavHighlight(&local_d8,IVar8,1);
  if ((flags & 0x40U) == 0) {
    local_e8[0].y = local_d8.Max.y;
    local_e8[0].x = local_d8.Max.x - local_f4;
    ImDrawList::AddRectFilled
              (pIVar10->DrawList,&local_d8.Min,local_e8,IVar9,(pIVar5->Style).FrameRounding,5);
  }
  text = local_90;
  if ((flags & 0x20U) == 0) {
    local_a0 = pIVar10->DrawList;
    local_e8[0].y = local_d8.Min.y;
    local_e8[0].x = local_d8.Max.x - local_f4;
    IVar9 = GetColorU32(((byte)(local_f5 | bVar7) & 1) + 0x15,1.0);
    ImDrawList::AddRectFilled
              (local_a0,local_e8,&local_d8.Max,IVar9,(pIVar5->Style).FrameRounding,
               (uint)(local_b8 <= local_f4) * 5 + 10);
    fVar12 = (pIVar5->Style).FramePadding.y;
    IVar3.y = fVar12 + local_d8.Min.y;
    IVar3.x = fVar12 + (local_d8.Max.x - local_f4);
    RenderArrow(IVar3,3,1.0);
  }
  p_min.y = local_d8.Min.y;
  p_min.x = local_d8.Min.x;
  p_max.y = local_d8.Max.y;
  p_max.x = local_d8.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar5->Style).FrameRounding);
  IVar2 = local_bc;
  if (local_98 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar3 = (pIVar5->Style).FramePadding;
    local_e8[0].x = IVar3.x + local_d8.Min.x;
    local_e8[0].y = IVar3.y + local_d8.Min.y;
    auVar4._8_8_ = 0;
    auVar4._0_4_ = local_80.Max.x;
    auVar4._4_4_ = local_80.Max.y;
    local_80 = (ImRect)(auVar4 << 0x40);
    RenderTextClipped(local_e8,&local_50,local_98,(char *)0x0,(ImVec2 *)0x0,&local_80.Min,
                      (ImRect *)0x0);
  }
  if (0.0 < (float)local_68._0_4_) {
    pos_00.y = (pIVar5->Style).FramePadding.y + local_d8.Min.y;
    pos_00.x = (pIVar5->Style).ItemInnerSpacing.x + local_d8.Max.x;
    RenderText(pos_00,text,(char *)0x0,true);
  }
  if (bVar6) {
    if (!bVar7) goto LAB_0013d8d3;
  }
  else if (pIVar5->NavActivateId == local_f0 && !bVar7) {
LAB_0013d8d3:
    if ((pIVar10->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
      pIVar10->NavLastIds[0] = local_f0;
    }
    OpenPopupEx(local_f0);
  }
  else if (!bVar7) {
    return false;
  }
  if (IVar2 != 0) {
    (pIVar5->NextWindowData).SizeConstraintCond = IVar2;
    fVar12 = (pIVar5->NextWindowData).SizeConstraintRect.Min.x;
    uVar11 = -(uint)(local_b8 <= fVar12);
    (pIVar5->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar11 & (uint)local_b8 | (uint)fVar12 & uVar11);
    goto LAB_0013d9de;
  }
  uVar11 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar11 = flags;
  }
  flags = uVar11;
  if ((flags & 4U) == 0) {
    if ((flags & 2U) != 0) {
      fVar12 = 4.0;
      goto LAB_0013d97f;
    }
    if ((flags & 8U) != 0) {
      fVar12 = 20.0;
      goto LAB_0013d97f;
    }
    fVar12 = 3.4028235e+38;
  }
  else {
    fVar12 = 8.0;
LAB_0013d97f:
    fVar13 = (GImGui->Style).WindowPadding.y;
    fVar1 = (GImGui->Style).ItemSpacing.y;
    fVar12 = fVar13 + fVar13 + ((GImGui->FontSize + fVar1) * fVar12 - fVar1);
  }
  local_e8[0].y = 0.0;
  local_e8[0].x = local_b8;
  local_80.Min.y = fVar12;
  local_80.Min.x = 3.4028235e+38;
  SetNextWindowSizeConstraints(local_e8,&local_80.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
LAB_0013d9de:
  ImFormatString((char *)local_e8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar5->BeginPopupStack).Size);
  pIVar10 = FindWindowByName((char *)local_e8);
  if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WasActive == true)) {
    local_70 = CalcWindowExpectedSize(pIVar10);
    if ((flags & 1U) != 0) {
      pIVar10->AutoPosLastDirection = 0;
    }
    local_80 = GetWindowAllowedExtentRect(pIVar10);
    local_88.y = local_d8.Max.y;
    local_88.x = local_d8.Min.x;
    local_48 = FindBestWindowPosForPopupEx
                         (&local_88,&local_70,&pIVar10->AutoPosLastDirection,&local_80,&local_d8,
                          ImGuiPopupPositionPolicy_ComboBox);
    local_88.x = 0.0;
    local_88.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_88);
  }
  local_80.Min.y = (pIVar5->Style).WindowPadding.y;
  local_80.Min.x = (pIVar5->Style).FramePadding.x;
  PushStyleVar(1,&local_80.Min);
  bVar6 = Begin((char *)local_e8,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar6) {
    EndPopup();
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}